

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcCrossProductsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          double *categoryRates,float *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  int iVar5;
  reference pvVar6;
  long in_RCX;
  long lVar7;
  long in_RDX;
  long in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  undefined8 uVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int j_1;
  int k_2;
  double patternWeight;
  int j;
  int k_1;
  int k;
  float denominator;
  int v;
  int patternIndex;
  float weight;
  float scale;
  int category;
  float patternDenominator;
  vector<float,_std::allocator<float>_> tmp;
  int pattern;
  allocator_type *__a;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff60;
  int local_94;
  int local_90;
  int local_8c;
  uint local_88;
  int local_74;
  float local_70;
  allocator_type local_5d;
  undefined4 local_5c;
  vector<float,_std::allocator<float>_> local_58;
  int local_3c;
  long local_38;
  double local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_38 = in_R9;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_3c = 0;
      local_3c <
      *(int *)((long)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4); local_3c = local_3c + 1) {
    local_5c = 0;
    __a = &local_5d;
    std::allocator<float>::allocator((allocator<float> *)0x1a56bc);
    std::vector<float,_std::allocator<float>_>::vector
              (in_stack_ffffffffffffff60,
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (value_type_conflict2 *)in_RDI,__a);
    std::allocator<float>::~allocator((allocator<float> *)0x1a56e1);
    local_70 = 0.0;
    for (local_74 = 0;
        local_74 <
        (int)*(value_type_conflict2 *)
              ((long)&in_RDI[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + 4); local_74 = local_74 + 1) {
      dVar4 = (double)(float)*(double *)(local_20 + (long)local_74 * 8) * local_30;
      fVar1 = *(float *)(local_28 + (long)local_74 * 4);
      iVar5 = (local_74 *
               *(int *)((long)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 4) + local_3c) *
              *(int *)((long)&in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
      local_88 = 0;
      for (local_8c = 0;
          local_8c <
          *(int *)((long)&in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4); local_8c = local_8c + 1) {
        auVar8 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_18 + (long)(iVar5 + local_8c) * 4)),
                                 ZEXT416(*(uint *)(local_10 + (long)(iVar5 + local_8c) * 4)),
                                 ZEXT416(local_88));
        local_88 = auVar8._0_4_;
      }
      auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416(local_88),ZEXT416((uint)local_70));
      local_70 = auVar8._0_4_;
      for (local_90 = 0;
          local_90 <
          *(int *)((long)&in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4); local_90 = local_90 + 1) {
        for (local_94 = 0;
            local_94 <
            *(int *)((long)&in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4); local_94 = local_94 + 1) {
          fVar2 = *(float *)(local_18 + (long)(iVar5 + local_90) * 4);
          fVar3 = *(float *)(local_10 + (long)(iVar5 + local_94) * 4);
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_58,
                              (long)(local_90 *
                                     *(int *)((long)&in_RDI[1].
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish + 4) +
                                    local_94));
          auVar8 = vfmadd213ss_fma(ZEXT416((uint)(float)dVar4),
                                   ZEXT416((uint)(fVar2 * fVar3 * fVar1)),ZEXT416((uint)*pvVar6));
          *pvVar6 = auVar8._0_4_;
        }
      }
    }
    in_stack_ffffffffffffff60 =
         (vector<float,_std::allocator<float>_> *)
         (*(double *)
           (in_RDI[5].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + (long)local_3c * 2) / (double)local_70);
    auVar9 = ZEXT864(in_stack_ffffffffffffff60);
    for (in_stack_ffffffffffffff5c = 0;
        in_stack_ffffffffffffff5c <
        *(int *)((long)&in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 4);
        in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c + 1) {
      for (in_stack_ffffffffffffff58 = 0; uVar10 = auVar9._8_8_,
          in_stack_ffffffffffffff58 <
          *(int *)((long)&in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4);
          in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 + 1) {
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&local_58,
                            (long)(in_stack_ffffffffffffff5c *
                                   *(int *)((long)&in_RDI[1].
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data._M_finish + 4) +
                                  in_stack_ffffffffffffff58));
        auVar11._0_8_ = (double)*pvVar6;
        auVar11._8_8_ = uVar10;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = in_stack_ffffffffffffff60;
        lVar7 = (long)(in_stack_ffffffffffffff5c *
                       *(int *)((long)&in_RDI[1].super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_finish + 4) +
                      in_stack_ffffffffffffff58);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)(local_38 + lVar7 * 8);
        auVar8 = vfmadd213sd_fma(auVar8,auVar11,auVar12);
        auVar9 = ZEXT1664(auVar8);
        *(long *)(local_38 + lVar7 * 8) = auVar8._0_8_;
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector(in_RDI);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                  const REALTYPE *preOrderPartial,
                                                                  const double *categoryRates,
                                                                  const REALTYPE *categoryWeights,
                                                                  const double edgeLength,
                                                                  double *outCrossProducts,
                                                                  double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE denominator = 0.0;
            for (int k = 0; k < kStateCount; k++) {
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }
            patternDenominator += denominator * weight;

            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    tmp[k * kStateCount + j] += preOrderPartial[v + k] * postOrderPartial[v + j] * weight * scale;
                }
            }
        }

        const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < kStateCount; k++) {
            for (int j = 0; j < kStateCount; j++) {
                outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
            }
        }
    }
}